

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Publication * __thiscall
helics::ValueFederate::registerPublication
          (ValueFederate *this,string_view name,string_view type,string_view units)

{
  string_view addition;
  Publication *pPVar1;
  undefined8 in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  undefined1 in_stack_00000068 [16];
  string_view in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Federate *this_01;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  this_01 = (Federate *)&stack0x00000008;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x285ed2);
  addition._M_str = in_stack_ffffffffffffff68;
  addition._M_len = in_stack_ffffffffffffff60;
  Federate::localNameGenerator_abi_cxx11_(this_01,addition);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this_01->currentMode;
  pPVar1 = ValueFederateManager::registerPublication
                     ((ValueFederateManager *)in_stack_00000050,(string_view)in_stack_00000068,
                      (string_view)in_stack_00000058,in_stack_00000080);
  std::__cxx11::string::~string(this_00);
  return pPVar1;
}

Assistant:

Publication& ValueFederate::registerPublication(std::string_view name,
                                                std::string_view type,
                                                std::string_view units)
{
    return vfManager->registerPublication(localNameGenerator(name), type, units);
}